

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O0

void pbrt::pbrt2obj(int ac,char **av)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  runtime_error *prVar4;
  ostream *poVar5;
  long lVar6;
  long in_RSI;
  int in_EDI;
  runtime_error e;
  string *in_stack_000000d0;
  string *in_stack_000000d8;
  shared_ptr<pbrt::Scene> scene;
  string arg;
  int i;
  string outFileName;
  string inFileName;
  shared_ptr<pbrt::Object> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  string *s;
  char *in_stack_fffffffffffffdd8;
  allocator *paVar7;
  undefined1 local_169 [40];
  allocator local_141;
  string local_140 [40];
  affine3f *in_stack_fffffffffffffee8;
  SP *in_stack_fffffffffffffef0;
  string local_108 [55];
  undefined1 local_d1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  int local_68;
  allocator local_51;
  string local_50 [8];
  string *in_stack_ffffffffffffffb8;
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  std::__cxx11::string::string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"a.obj",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_68 = 1;
  do {
    if (local_4 <= local_68) {
      std::ofstream::open((string *)out,(_Ios_Openmode)local_50);
      defineDefaultMaterials((ofstream *)0x10d853);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"parsing: ");
      poVar5 = std::operator<<(poVar5,local_30);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::shared_ptr<pbrt::Scene>::shared_ptr((shared_ptr<pbrt::Scene> *)0x10d8d5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,".pbrt",(allocator *)&stack0xfffffffffffffef7);
      bVar1 = endsWith(in_stack_fffffffffffffdd0,
                       (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
      if (bVar1) {
        paVar7 = &local_141;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_140,"",paVar7);
        importPBRT(in_stack_000000d8,in_stack_000000d0);
        std::shared_ptr<pbrt::Scene>::operator=
                  ((shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffd90,
                   (shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffd88);
        std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x10d9b2);
        std::__cxx11::string::~string(local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
      }
      else {
        s = (string *)local_169;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_169 + 1),".pbf",(allocator *)s);
        bVar2 = endsWith(s,(string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
        std::__cxx11::string::~string((string *)(local_169 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_169);
        if ((bVar2 & 1) == 0) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"un-recognized input file extension");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        Scene::loadFrom(in_stack_ffffffffffffffb8);
        std::shared_ptr<pbrt::Scene>::operator=
                  ((shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffd90,
                   (shared_ptr<pbrt::Scene> *)in_stack_fffffffffffffd88);
        std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x10db24);
      }
      poVar5 = std::operator<<((ostream *)&std::cout," => yay! parsing successful...");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "done parsing, now exporting (triangular geometry from) scene");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x10dc57);
      std::shared_ptr<pbrt::Object>::shared_ptr
                ((shared_ptr<pbrt::Object> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      math::affine3f::identity();
      writeObject(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x10dc9e);
      std::shared_ptr<pbrt::Scene>::~shared_ptr((shared_ptr<pbrt::Scene> *)0x10ddd6);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_30);
      return;
    }
    pcVar3 = *(char **)(local_10 + (long)local_68 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,pcVar3,&local_89);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
    if (*pcVar3 == '-') {
      bVar1 = std::operator==(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
      if (!bVar1) {
        local_d1 = 1;
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        std::operator+(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
        std::runtime_error::runtime_error(prVar4,local_b0);
        local_d1 = 0;
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar6 = (long)local_68;
      local_68 = local_68 + 1;
      std::__cxx11::string::operator=(local_50,*(char **)(local_10 + 8 + lVar6 * 8));
    }
    else {
      std::__cxx11::string::operator=(local_30,local_88);
    }
    std::__cxx11::string::~string(local_88);
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

void pbrt2obj(int ac, char **av)
  {
    std::string inFileName;
    std::string outFileName = "a.obj";
    for (int i=1;i<ac;i++) {
      const std::string arg = av[i];
      if (arg[0] == '-') {
        if (arg == "-o")
          outFileName = av[++i];
        else
          throw std::runtime_error("invalid argument '"+arg+"'");
      } else {
        inFileName = arg;
      }          
    }
    out.open(outFileName);
    // out = fopen(outFileName.c_str(),"w");
    assert(out.good());

    defineDefaultMaterials(out);
    
  
    std::cout << "-------------------------------------------------------" << std::endl;
    std::cout << "parsing: " << inFileName << std::endl;
      
    std::shared_ptr<Scene> scene;
    try {
      if (endsWith(inFileName,".pbrt"))
        scene = importPBRT(inFileName);
      else if (endsWith(inFileName,".pbf"))
        scene = Scene::loadFrom(inFileName);
      else
        throw std::runtime_error("un-recognized input file extension");
        
      std::cout << " => yay! parsing successful..." << std::endl;
        
      std::cout << "done parsing, now exporting (triangular geometry from) scene" << std::endl;
      writeObject(scene->world,affine3f::identity());
    } catch (std::runtime_error e) {
      std::cerr << "**** ERROR IN PARSING ****" << std::endl << e.what() << std::endl;
      std::cerr << "(this means that either there's something wrong with that PBRT file, or that the parser can't handle it)" << std::endl;
      exit(1);
    }
  }